

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O2

DWORD __thiscall HMISong::TrackInfo::ReadVarLenHMP(TrackInfo *this)

{
  uint uVar1;
  byte bVar2;
  size_t sVar3;
  uint uVar4;
  
  uVar1 = 0;
  uVar4 = 0;
  bVar2 = 0;
  sVar3 = this->TrackP;
  while ((-1 < (char)uVar4 && (sVar3 < this->MaxTrackP))) {
    this->TrackP = sVar3 + 1;
    uVar4 = (uint)this->TrackBegin[sVar3];
    uVar1 = uVar1 | (uVar4 & 0x7f) << (bVar2 & 0x1f);
    bVar2 = bVar2 + 7;
    sVar3 = sVar3 + 1;
  }
  return uVar1;
}

Assistant:

DWORD HMISong::TrackInfo::ReadVarLenHMP()
{
	DWORD time = 0;
	BYTE t = 0;
	int off = 0;

	while (!(t & 0x80) && TrackP < MaxTrackP)
	{
		t = TrackBegin[TrackP++];
		time |= (t & 127) << off;
		off += 7;
	}
	return time;
}